

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O2

Vec_Wrd_t * Ifd_ManDsdTruths(int nVars)

{
  Vec_Wrd_t *pVVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Ifd_Man_t *p;
  Ifd_Obj_t *pIVar9;
  Ifd_Obj_t *pIVar10;
  Ifd_Obj_t *pIVar11;
  uint uVar12;
  uint i;
  uint uVar13;
  Vec_Int_t *pVVar14;
  uint uVar15;
  uint local_74;
  
  uVar15 = 2;
  p = Ifd_ManStart();
  local_74 = 1;
  do {
    uVar3 = 1;
    if (nVars < (int)uVar15) {
      Ifd_ManTruthAll(p);
      Mpm_ComputeCnfSizeAll(p);
      pVVar1 = p->vTruths;
      p->vTruths = (Vec_Wrd_t *)0x0;
      Ifd_ManStop(p);
      return pVVar1;
    }
    while (uVar12 = uVar3, uVar3 = 1, uVar12 != uVar15) {
      while (uVar13 = uVar3, uVar3 = uVar12 + 1, uVar13 != uVar15) {
        if (uVar13 + uVar12 == uVar15) {
          pVVar14 = p->vMarks;
          iVar2 = Vec_IntEntry(pVVar14,uVar12);
          uVar3 = uVar13 + 1;
          while ((iVar4 = Vec_IntEntry(pVVar14,uVar12 + 1), iVar2 < iVar4 &&
                 (pIVar9 = Ifd_ManObj(p,iVar2), pIVar9 != (Ifd_Obj_t *)0x0))) {
            iVar4 = Vec_IntEntry(pVVar14,uVar13);
            while ((iVar5 = Vec_IntEntry(pVVar14,uVar3), iVar4 < iVar5 &&
                   (pIVar10 = Ifd_ManObj(p,iVar4), pIVar10 != (Ifd_Obj_t *)0x0))) {
              if (((byte)pIVar9->field_0x3 & 0x1f) != uVar12) {
                __assert_fail("(int)pLeaf0->nSupp == i",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                              ,0x288,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
              }
              if (((byte)pIVar10->field_0x3 & 0x1f) != uVar13) {
                __assert_fail("(int)pLeaf1->nSupp == j",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                              ,0x289,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
              }
              iVar5 = Abc_Var2Lit(iVar2,0);
              iVar6 = Abc_Var2Lit(iVar4,0);
              Ifd_ManOper(p,iVar5,iVar6,-1,1);
              if (-1 < *(int *)pIVar10) {
                iVar5 = Abc_Var2Lit(iVar2,0);
                iVar6 = Abc_Var2Lit(iVar4,1);
                Ifd_ManOper(p,iVar5,iVar6,-1,1);
              }
              if (-1 < *(int *)pIVar9) {
                iVar5 = Abc_Var2Lit(iVar2,1);
                iVar6 = Abc_Var2Lit(iVar4,0);
                Ifd_ManOper(p,iVar5,iVar6,-1,1);
                if ((-1 < *(int *)pIVar9) && (-1 < *(int *)pIVar10)) {
                  iVar5 = Abc_Var2Lit(iVar2,1);
                  iVar6 = Abc_Var2Lit(iVar4,1);
                  Ifd_ManOper(p,iVar5,iVar6,-1,1);
                }
              }
              iVar5 = Abc_Var2Lit(iVar2,0);
              iVar6 = Abc_Var2Lit(iVar4,0);
              Ifd_ManOper(p,iVar5,iVar6,-1,2);
              iVar4 = iVar4 + 1;
              pVVar14 = p->vMarks;
            }
            iVar2 = iVar2 + 1;
          }
        }
        else {
          uVar3 = uVar13 + 1;
        }
      }
    }
    while (uVar12 = uVar3, uVar12 != local_74) {
      uVar3 = 1;
      while (uVar13 = uVar3, uVar3 = uVar12 + 1, uVar13 != local_74) {
        uVar3 = 1;
        while (i = uVar3, uVar3 = uVar13 + 1, i != local_74) {
          if (uVar13 + uVar12 + i == uVar15) {
            pVVar14 = p->vMarks;
            iVar2 = Vec_IntEntry(pVVar14,uVar12);
            uVar3 = i + 1;
            while ((iVar4 = Vec_IntEntry(pVVar14,uVar12 + 1), iVar2 < iVar4 &&
                   (pIVar9 = Ifd_ManObj(p,iVar2), pIVar9 != (Ifd_Obj_t *)0x0))) {
              iVar4 = Vec_IntEntry(pVVar14,uVar13);
              while ((iVar5 = Vec_IntEntry(pVVar14,uVar13 + 1), iVar4 < iVar5 &&
                     (pIVar10 = Ifd_ManObj(p,iVar4), pIVar10 != (Ifd_Obj_t *)0x0))) {
                iVar5 = Vec_IntEntry(pVVar14,i);
                while ((iVar6 = Vec_IntEntry(pVVar14,uVar3), iVar5 < iVar6 &&
                       (pIVar11 = Ifd_ManObj(p,iVar5), pIVar11 != (Ifd_Obj_t *)0x0))) {
                  if (((byte)pIVar9->field_0x3 & 0x1f) != uVar12) {
                    __assert_fail("(int)pLeaf0->nSupp == i",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                  ,0x29f,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                  }
                  if (((byte)pIVar10->field_0x3 & 0x1f) != uVar13) {
                    __assert_fail("(int)pLeaf1->nSupp == j",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                  ,0x2a0,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                  }
                  if ((*(uint *)pIVar11 >> 0x18 & 0x1f) != i) {
                    __assert_fail("(int)pLeaf2->nSupp == k",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmPre.c"
                                  ,0x2a1,"Vec_Wrd_t *Ifd_ManDsdTruths(int)");
                  }
                  if ((-1 < (int)*(uint *)pIVar11) || (iVar4 <= iVar2)) {
                    iVar6 = Abc_Var2Lit(iVar2,0);
                    iVar7 = Abc_Var2Lit(iVar4,0);
                    iVar8 = Abc_Var2Lit(iVar5,0);
                    Ifd_ManOper(p,iVar6,iVar7,iVar8,3);
                    if ((-1 < *(int *)pIVar9) && (-1 < *(int *)pIVar10)) {
                      iVar6 = Abc_Var2Lit(iVar2,1);
                      iVar7 = Abc_Var2Lit(iVar4,0);
                      iVar8 = Abc_Var2Lit(iVar5,0);
                      Ifd_ManOper(p,iVar6,iVar7,iVar8,3);
                    }
                  }
                  iVar5 = iVar5 + 1;
                  pVVar14 = p->vMarks;
                }
                iVar4 = iVar4 + 1;
              }
              iVar2 = iVar2 + 1;
            }
          }
          else {
            uVar3 = i + 1;
          }
        }
      }
    }
    Vec_IntPush(p->vMarks,p->nObjs);
    uVar15 = uVar15 + 1;
    local_74 = local_74 + 1;
  } while( true );
}

Assistant:

Vec_Wrd_t * Ifd_ManDsdTruths( int nVars )
{
    int fUseMux = 1;
    Vec_Wrd_t * vTruths;
    Ifd_Man_t * pMan = Ifd_ManStart();
    Ifd_Obj_t * pLeaf0, * pLeaf1, * pLeaf2;
    int v, i, j, k, c0, c1, c2;
    for ( v = 2; v <= nVars; v++ )
    {
        // create ANDs/XORs
        for ( i = 1; i < v; i++ )
        for ( j = 1; j < v; j++ )
        if ( i + j == v )
        {
            Ifd_ManForEachNodeWithSupp( pMan, i, pLeaf0, c0 )
            Ifd_ManForEachNodeWithSupp( pMan, j, pLeaf1, c1 )
            {
                assert( (int)pLeaf0->nSupp == i );
                assert( (int)pLeaf1->nSupp == j );
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 0), -1, 1 );
                if ( !pLeaf1->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 1), -1, 1 );
                if ( !pLeaf0->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 1), Abc_Var2Lit(c1, 0), -1, 1 );
                if ( !pLeaf0->fWay && !pLeaf1->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 1), Abc_Var2Lit(c1, 1), -1, 1 );
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 0), -1, 2 );
            }
        }
        // create MUX
        if ( fUseMux )
        for ( i = 1; i < v-1; i++ )
        for ( j = 1; j < v-1; j++ )
        for ( k = 1; k < v-1; k++ )
        if ( i + j + k == v )
        {
            Ifd_ManForEachNodeWithSupp( pMan, i, pLeaf0, c0 )
            Ifd_ManForEachNodeWithSupp( pMan, j, pLeaf1, c1 )
            Ifd_ManForEachNodeWithSupp( pMan, k, pLeaf2, c2 )
            {
                assert( (int)pLeaf0->nSupp == i );
                assert( (int)pLeaf1->nSupp == j );
                assert( (int)pLeaf2->nSupp == k );
//printf( "%d %d %d   ", i, j, k );
//printf( "%d %d %d\n", Ifd_ObjId(pMan, pLeaf0), Ifd_ObjId(pMan, pLeaf1), Ifd_ObjId(pMan, pLeaf2) );
                if ( pLeaf2->fWay && c0 < c1 )
                    continue;
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 0), Abc_Var2Lit(c1, 0), Abc_Var2Lit(c2, 0), 3 );
                if ( !pLeaf0->fWay && !pLeaf1->fWay )
                Ifd_ManOper( pMan, Abc_Var2Lit(c0, 1), Abc_Var2Lit(c1, 0), Abc_Var2Lit(c2, 0), 3 );
            }
        }
        // bookmark
        Vec_IntPush( pMan->vMarks, pMan->nObjs );
    }
    Ifd_ManTruthAll( pMan );
    Mpm_ComputeCnfSizeAll( pMan );
//    Ifd_ManPrint( pMan );
    vTruths = pMan->vTruths; pMan->vTruths = NULL;
    Ifd_ManStop( pMan );
    return vTruths;
}